

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O1

void __thiscall CVmMetaTable::rebuild_image(CVmMetaTable *this,CVmImageWriter *writer)

{
  vm_meta_entry_t *pvVar1;
  ulong uVar2;
  uint prop_id;
  ushort uVar3;
  int iVar4;
  ulong uVar5;
  
  CVmImageWriter::begin_meta_dep(writer,(int)this->count_);
  if (this->count_ != 0) {
    uVar5 = 0;
    do {
      pvVar1 = this->table_;
      iVar4 = (int)uVar5;
      CVmImageWriter::write_meta_dep_item(writer,pvVar1[iVar4].image_meta_name_);
      if (pvVar1[iVar4].func_xlat_cnt_ != 0) {
        uVar2 = 1;
        uVar3 = 2;
        do {
          prop_id = 0;
          if (uVar3 != 1) {
            prop_id = (uint)pvVar1[iVar4].func_xlat_[(int)uVar2 - 1];
          }
          CVmImageWriter::write_meta_item_prop(writer,prop_id);
          uVar2 = (ulong)uVar3;
          uVar3 = uVar3 + 1;
        } while (uVar2 <= pvVar1[iVar4].func_xlat_cnt_);
      }
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->count_);
  }
  CVmImageWriter::end_meta_dep(writer);
  return;
}

Assistant:

void CVmMetaTable::rebuild_image(CVmImageWriter *writer)
{
    size_t i;
    
    /* begin the new metaclass dependency table */
    writer->begin_meta_dep(get_count());

    /* write the new metaclass dependency table items */
    for (i = 0 ; i < get_count() ; ++i)
    {
        vm_meta_entry_t *entry;
        ushort j;

        /* get this entry */
        entry = get_entry(i);
        
        /* write this metaclass name */
        writer->write_meta_dep_item(entry->image_meta_name_);

        /* 
         *   Write the property translation list.  Note that xlat_func()
         *   requires a 1-based index, so we loop from 1 to the count,
         *   rather than following the usual C-style 0-based conventions.  
         */
        for (j = 1 ; j <= entry->func_xlat_cnt_ ; ++j)
            writer->write_meta_item_prop(entry->xlat_func(j));
    }
    
    /* end the metaclass dependency table */
    writer->end_meta_dep();
}